

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

void __thiscall minja::VariableExpr::~VariableExpr(VariableExpr *this)

{
  ~VariableExpr(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

VariableExpr(const Location & location, const std::string& n)
      : Expression(location), name(n) {}